

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_bitread.c
# Opt level: O1

MPP_RET update_curbyte_h264(BitReadCtx_t *bitctx)

{
  byte *pbVar1;
  MPP_RET MVar2;
  ulong uVar3;
  RK_U32 RVar4;
  
  MVar2 = MPP_ERR_READ_BIT;
  if (bitctx->bytes_left_ != 0) {
    if ((*bitctx->data_ == '\x03') && ((short)bitctx->prev_two_bytes_ == 0)) {
      bitctx->data_ = bitctx->data_ + 1;
      bitctx->emulation_prevention_bytes_ = bitctx->emulation_prevention_bytes_ + 1;
      bitctx->used_bits = bitctx->used_bits + 8;
      RVar4 = bitctx->bytes_left_ - 1;
      bitctx->bytes_left_ = RVar4;
      bitctx->prev_two_bytes_ = 0xffff;
      if (RVar4 == 0) {
        return MPP_ERR_READ_BIT;
      }
    }
    pbVar1 = bitctx->data_;
    bitctx->data_ = pbVar1 + 1;
    uVar3 = (ulong)*pbVar1;
    bitctx->curr_byte_ = uVar3;
    bitctx->bytes_left_ = bitctx->bytes_left_ - 1;
    bitctx->num_remaining_bits_in_curr_byte_ = 8;
    bitctx->prev_two_bytes_ = bitctx->prev_two_bytes_ << 8 | uVar3;
    MVar2 = MPP_OK;
  }
  return MVar2;
}

Assistant:

static MPP_RET update_curbyte_h264(BitReadCtx_t *bitctx)
{
    if (bitctx->bytes_left_ < 1)
        return  MPP_ERR_READ_BIT;

    // Emulation prevention three-byte detection.
    // If a sequence of 0x000003 is found, skip (ignore) the last byte (0x03).
    if ((*bitctx->data_ == 0x03)
        && ((bitctx->prev_two_bytes_ & 0xffff) == 0)) {
        // Detected 0x000003, skip last byte.
        ++bitctx->data_;
        --bitctx->bytes_left_;
        ++bitctx->emulation_prevention_bytes_;
        bitctx->used_bits += 8;
        // Need another full three bytes before we can detect the sequence again.
        bitctx->prev_two_bytes_ = 0xffff;
        if (bitctx->bytes_left_ < 1)
            return  MPP_ERR_READ_BIT;
    }
    // Load a new byte and advance pointers.
    bitctx->curr_byte_ = *bitctx->data_++ & 0xff;
    --bitctx->bytes_left_;
    bitctx->num_remaining_bits_in_curr_byte_ = 8;
    bitctx->prev_two_bytes_ = (bitctx->prev_two_bytes_ << 8) | bitctx->curr_byte_;

    return MPP_OK;
}